

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *param_1)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImVec2 *pIVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImRect IVar9;
  
  IVar2 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar5 = (GImGui->IO).DisplayVisibleMin.x;
  pIVar3 = &(GImGui->IO).DisplayVisibleMax;
  if ((fVar5 != pIVar3->x) || (NAN(fVar5) || NAN(pIVar3->x))) {
    fVar5 = (GImGui->IO).DisplayVisibleMin.y;
    pfVar1 = &(GImGui->IO).DisplayVisibleMax.y;
    if ((fVar5 != *pfVar1) || (NAN(fVar5) || NAN(*pfVar1))) {
      IVar4 = (GImGui->IO).DisplayVisibleMin;
      pIVar3 = &(GImGui->IO).DisplayVisibleMax;
      goto LAB_00125c33;
    }
  }
  pIVar3 = &(GImGui->IO).DisplaySize;
  IVar4.x = 0.0;
  IVar4.y = 0.0;
LAB_00125c33:
  fVar5 = IVar2.x;
  fVar6 = IVar2.y;
  fVar7 = (*pIVar3).x;
  fVar8 = (*pIVar3).y;
  fVar5 = (float)(-(uint)(fVar5 + fVar5 < fVar7 - IVar4.x) & (uint)-fVar5);
  fVar6 = (float)(-(uint)(fVar6 + fVar6 < fVar8 - IVar4.y) & (uint)-fVar6);
  IVar9.Min.x = IVar4.x - fVar5;
  IVar9.Min.y = IVar4.y - fVar6;
  IVar9.Max.x = fVar5 + fVar7;
  IVar9.Max.y = fVar6 + fVar8;
  return IVar9;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow*)
{
    ImVec2 padding = GImGui->Style.DisplaySafeAreaPadding;
    ImRect r_screen = GetViewportRect();
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}